

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::MapKeyDataOnlyByteSize(FieldDescriptor *field,MapKey *value)

{
  Type TVar1;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  LogMessage *in_stack_fffffffffffffee0;
  LogMessage *this;
  undefined8 in_stack_fffffffffffffee8;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffef0;
  LogMessage local_e0;
  MapKey *in_stack_ffffffffffffff70;
  size_t local_8;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  TVar1 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffef0);
  switch(TVar1) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
  case TYPE_GROUP:
  case TYPE_MESSAGE:
  case TYPE_BYTES:
  case TYPE_ENUM:
    LogMessage::LogMessage
              ((LogMessage *)&stack0xffffffffffffff60,level,(char *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffedc);
    LogMessage::operator<<
              (in_stack_fffffffffffffee0,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffee0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    LogMessage::~LogMessage((LogMessage *)0x460fe4);
    local_8 = 0;
    break;
  case TYPE_INT64:
    MapKey::GetInt64Value(in_stack_ffffffffffffff70);
    local_8 = WireFormatLite::Int64Size(0x461051);
    break;
  case TYPE_UINT64:
    MapKey::GetUInt64Value(in_stack_ffffffffffffff70);
    local_8 = WireFormatLite::UInt64Size(0x461094);
    break;
  case TYPE_INT32:
    MapKey::GetInt32Value(in_stack_ffffffffffffff70);
    local_8 = WireFormatLite::Int32Size(0);
    break;
  case TYPE_FIXED64:
    local_8 = 8;
    break;
  case TYPE_FIXED32:
    local_8 = 4;
    break;
  case TYPE_BOOL:
    local_8 = 1;
    break;
  case TYPE_STRING:
    MapKey::GetStringValue_abi_cxx11_(in_stack_ffffffffffffff70);
    local_8 = WireFormatLite::StringSize((string *)0x4610f9);
    break;
  case TYPE_UINT32:
    MapKey::GetUInt32Value(in_stack_ffffffffffffff70);
    local_8 = WireFormatLite::UInt32Size(0);
    break;
  case TYPE_SFIXED32:
    local_8 = 4;
    break;
  case TYPE_SFIXED64:
    local_8 = 8;
    break;
  case TYPE_SINT32:
    MapKey::GetInt32Value(in_stack_ffffffffffffff70);
    local_8 = WireFormatLite::SInt32Size(0);
    break;
  case MAX_TYPE:
    MapKey::GetInt64Value(in_stack_ffffffffffffff70);
    local_8 = WireFormatLite::SInt64Size(0x4610d7);
    break;
  default:
    this = &local_e0;
    LogMessage::LogMessage(in_stack_fffffffffffffef0,level,(char *)this,in_stack_fffffffffffffedc);
    LogMessage::operator<<
              (this,(char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    LogFinisher::operator=
              ((LogFinisher *)this,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    LogMessage::~LogMessage((LogMessage *)0x4611ae);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t MapKeyDataOnlyByteSize(const FieldDescriptor* field,
                                     const MapKey& value) {
  GOOGLE_DCHECK_EQ(FieldDescriptor::TypeToCppType(field->type()), value.type());
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      GOOGLE_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  GOOGLE_LOG(FATAL) << "Cannot get here";
  return 0;
}